

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_lcp_2way_unstable<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_output_00;
  lcp_t *lcp_output_00;
  MergeResult MVar1;
  MergeResult MVar2;
  lcp_t lVar3;
  size_t n_00;
  ulong uVar4;
  lcp_t *plVar5;
  lcp_t *lcp_input0;
  uchar **ppuVar6;
  uchar **from0;
  uint uVar7;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    for (uVar7 = 1; uVar4 = (ulong)(uVar7 - 1), uVar4 < n - 1; uVar7 = uVar7 + 1) {
      lVar3 = lcp(strings_input[uVar4],strings_input[uVar7]);
      lcp_input[uVar4] = lVar3;
    }
LAB_001d273d:
    MVar1 = SortedInPlace;
  }
  else {
    uVar4 = n >> 1;
    MVar1 = mergesort_lcp_2way_unstable<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar4);
    plVar5 = lcp_input;
    ppuVar6 = strings_input;
    if (MVar1 != SortedInPlace) {
      plVar5 = lcp_output;
      ppuVar6 = strings_output;
    }
    check_input(ppuVar6,plVar5,uVar4);
    ppuVar6 = strings_input + uVar4;
    strings_output_00 = strings_output + uVar4;
    plVar5 = lcp_input + uVar4;
    lcp_output_00 = lcp_output + uVar4;
    n_00 = n - uVar4;
    MVar2 = mergesort_lcp_2way_unstable<true>(ppuVar6,strings_output_00,plVar5,lcp_output_00,n_00);
    lcp_input0 = plVar5;
    from0 = ppuVar6;
    if (MVar2 != SortedInPlace) {
      lcp_input0 = lcp_output_00;
      from0 = strings_output_00;
    }
    check_input(from0,lcp_input0,n_00);
    if (MVar1 == MVar2) {
      if (MVar1 != SortedInPlace) {
        merge_lcp_2way_unstable<true>
                  (strings_output,lcp_output,uVar4,strings_output_00,lcp_output_00,n_00,
                   strings_input,lcp_input);
        goto LAB_001d273d;
      }
    }
    else {
      if (MVar1 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x6b7,
                      "MergeResult mergesort_lcp_2way_unstable(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      memcpy(ppuVar6,strings_output_00,n_00 * 8);
      memcpy(plVar5,lcp_output_00,n_00 * 8);
    }
    merge_lcp_2way_unstable<true>
              (strings_input,lcp_input,uVar4,ppuVar6,plVar5,n_00,strings_output,lcp_output);
    MVar1 = SortedInTemp;
  }
  return MVar1;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml = mergesort_lcp_2way_unstable<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);

	debug() << __func__ << "(): checking first merge\n";
	if (ml == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);

	MergeResult mr = mergesort_lcp_2way_unstable<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);

	debug() << __func__ << "(): checking second merge\n";
	if (mr == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  n-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, n-split0);

	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}